

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt-errors.c
# Opt level: O3

void gopt_errors(char *argv0,option *options)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  
  uVar3 = 0xffffffff;
  do {
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while ((options[uVar3].flags & 0x100) == 0);
  iVar7 = (int)options[uVar3].short_name;
  if (iVar7 == 0) {
    pcVar5 = options[uVar3].long_name;
    if (pcVar5 == (char *)0x0) {
      if (uVar2 != 0) {
        lVar4 = 0;
        do {
          uVar1 = *(uint *)((long)&options->flags + lVar4);
          uVar8 = ~uVar1;
          if ((uVar8 & 0x12) == 0) {
            iVar7 = (int)(&options->short_name)[lVar4];
            pcVar5 = "%s: option -%c requires an option-argument\n";
            goto LAB_00102eae;
          }
          if ((uVar8 & 0x21) == 0) {
            iVar7 = (int)(&options->short_name)[lVar4];
            pcVar5 = "%s: option -%c must not have an option-argument\n";
            goto LAB_00102eae;
          }
          if ((uVar8 & 0x42) == 0) {
            pcVar5 = *(char **)((long)&options->long_name + lVar4);
            pcVar6 = "%s: option --%s requires an option-argument\n";
            goto LAB_00102eea;
          }
          if ((uVar8 & 0x81) == 0) {
            pcVar5 = *(char **)((long)&options->long_name + lVar4);
            pcVar6 = "%s: option --%s must not have an option-argument\n";
            goto LAB_00102eea;
          }
          if (((uVar1 & 8) == 0) && (1 < *(uint *)((long)&options->count + lVar4))) {
            __fprintf_chk(_stderr,1,"%s: option -%c/--%s may not be repeated\n",argv0,
                          (int)(&options->short_name)[lVar4],
                          *(undefined8 *)((long)&options->long_name + lVar4));
            goto LAB_00102f1f;
          }
          lVar4 = lVar4 + 0x20;
        } while ((ulong)uVar2 << 5 != lVar4);
      }
      return;
    }
    pcVar6 = "%s: unrecognised option --%s\n";
LAB_00102eea:
    __fprintf_chk(_stderr,1,pcVar6,argv0,pcVar5);
  }
  else {
    pcVar5 = "%s: unrecognised option -%c\n";
LAB_00102eae:
    __fprintf_chk(_stderr,1,pcVar5,argv0,iVar7);
  }
LAB_00102f1f:
  exit(1);
}

Assistant:

void gopt_errors (const char *argv0, const struct option *options)
{
  unsigned int bad_option_index = 0;
  unsigned int i;

  while (!(options[bad_option_index].flags & GOPT_LAST))
  {
    bad_option_index++;
  }

  if (options[bad_option_index].short_name)
  {
    fprintf (stderr, "%s: unrecognised option -%c\n", argv0, options[bad_option_index].short_name);
    exit (EX_USAGE);
  }

  if (options[bad_option_index].long_name)
  {
    fprintf (stderr, "%s: unrecognised option --%s\n", argv0, options[bad_option_index].long_name);
    exit (EX_USAGE);
  }

  for (i = 0; i < bad_option_index; i++)
  {
    if ((options[i].flags & GOPT_SEEN_SHORT_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option -%c requires an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_SHORT_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option -%c must not have an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option --%s requires an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option --%s must not have an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].count > 1) && !(options[i].flags & GOPT_REPEATABLE))
    {
      fprintf (stderr, "%s: option -%c/--%s may not be repeated\n", argv0, options[i].short_name, options[i].long_name);
      exit (EX_USAGE);
    }
  }
}